

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tools.hh
# Opt level: O3

unsigned_long
phosg::parallel_range_blocks<unsigned_long>
          (function<bool_(unsigned_long,_unsigned_long)> *fn,unsigned_long start_value,
          unsigned_long end_value,unsigned_long block_size,size_t num_threads,
          function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *progress_fn)

{
  atomic<unsigned_long> aVar1;
  unsigned_long __args;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *this;
  uint uVar2;
  ulong uVar3;
  uint64_t __args_3;
  logic_error *this_00;
  thread *t;
  pointer ptVar4;
  pointer ptVar5;
  atomic<unsigned_long> result_value;
  atomic<unsigned_long> current_value;
  unsigned_long end_value_local;
  vector<std::thread,_std::allocator<std::thread>_> local_88;
  unsigned_long local_68;
  function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)> *local_60;
  ulong local_58;
  reference_wrapper<std::atomic<unsigned_long>_> local_50;
  reference_wrapper<std::atomic<unsigned_long>_> local_48;
  reference_wrapper<std::function<bool_(unsigned_long,_unsigned_long)>_> local_40;
  unsigned_long block_size_local;
  
  end_value_local = end_value;
  block_size_local = block_size;
  if ((end_value - start_value) % block_size != 0) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error(this_00,"block_size must evenly divide the entire range");
LAB_0010750f:
    __cxa_throw(this_00,&::std::logic_error::typeinfo,::std::logic_error::~logic_error);
  }
  local_68 = start_value;
  local_60 = progress_fn;
  if (num_threads == 0) {
    uVar2 = ::std::thread::hardware_concurrency();
    if (uVar2 == 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      ::std::logic_error::logic_error(this_00,"thread count must be at least 1");
      goto LAB_0010750f;
    }
    num_threads = (size_t)uVar2;
  }
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  result_value.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)end_value;
  current_value.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)start_value;
  do {
    local_48._M_data = &current_value;
    local_50._M_data = &result_value;
    local_58 = uVar3;
    local_40._M_data = fn;
    ::std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(std::function<bool(unsigned_long,unsigned_long)>&,std::atomic<unsigned_long>&,std::atomic<unsigned_long>&,unsigned_long,unsigned_long,unsigned_long),std::reference_wrapper<std::function<bool(unsigned_long,unsigned_long)>>,std::reference_wrapper<std::atomic<unsigned_long>>,std::reference_wrapper<std::atomic<unsigned_long>>,unsigned_long&,unsigned_long&,unsigned_long>
              ((vector<std::thread,std::allocator<std::thread>> *)&local_88,
               parallel_range_blocks_thread_fn<unsigned_long>,&local_40,&local_48,&local_50,
               &end_value_local,&block_size_local,&local_58);
    this = local_60;
    uVar3 = (long)local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
  } while (uVar3 < num_threads);
  ptVar4 = local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  ptVar5 = local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((local_60->super__Function_base)._M_manager != (_Manager_type)0x0) {
    __args_3 = now();
    __args = local_68;
    while (ptVar4 = local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                    super__Vector_impl_data._M_start,
          ptVar5 = local_88.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,
          (ulong)current_value.super___atomic_base<unsigned_long>._M_i < end_value_local) {
      ::std::function<void_(unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>::operator()
                (this,__args,end_value_local,
                 (unsigned_long)current_value.super___atomic_base<unsigned_long>._M_i,__args_3);
      usleep(1000000);
    }
  }
  for (; aVar1.super___atomic_base<unsigned_long>._M_i =
              result_value.super___atomic_base<unsigned_long>._M_i, ptVar4 != ptVar5;
      ptVar4 = ptVar4 + 1) {
    ::std::thread::join();
  }
  ::std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_88);
  return aVar1.super___atomic_base<unsigned_long>._M_i._M_i;
}

Assistant:

IntT parallel_range_blocks(
    std::function<bool(IntT value, size_t thread_num)> fn,
    IntT start_value,
    IntT end_value,
    IntT block_size,
    size_t num_threads = 0,
    std::function<void(IntT start_value, IntT end_value, IntT current_value, uint64_t start_time_usecs)> progress_fn = parallel_range_default_progress_fn<IntT>) {
  if ((end_value - start_value) % block_size) {
    throw std::logic_error("block_size must evenly divide the entire range");
  }

  if (num_threads == 0) {
    num_threads = std::thread::hardware_concurrency();
  }
  if (num_threads < 1) {
    throw std::logic_error("thread count must be at least 1");
  }

  std::atomic<IntT> current_value(start_value);
  std::atomic<IntT> result_value(end_value);
  std::vector<std::thread> threads;
  while (threads.size() < num_threads) {
    threads.emplace_back(
        parallel_range_blocks_thread_fn<IntT>,
        std::ref(fn),
        std::ref(current_value),
        std::ref(result_value),
        end_value,
        block_size,
        threads.size());
  }

  if (progress_fn != nullptr) {
    uint64_t start_time = now();
    IntT progress_current_value;
    while ((progress_current_value = current_value.load()) < end_value) {
      progress_fn(start_value, end_value, progress_current_value, start_time);
      usleep(1000000);
    }
  }

  for (auto& t : threads) {
    t.join();
  }

  return result_value;
}